

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::CopyPropagateArrays::MemoryObject::Contains(MemoryObject *this,MemoryObject *other)

{
  bool bVar1;
  Instruction *pIVar2;
  Instruction *pIVar3;
  vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
  *pvVar4;
  size_type sVar5;
  size_type sVar6;
  const_reference this_00;
  const_reference other_00;
  uint local_24;
  uint32_t i;
  MemoryObject *other_local;
  MemoryObject *this_local;
  
  pIVar2 = GetVariable(this);
  pIVar3 = GetVariable(other);
  if (pIVar2 == pIVar3) {
    pvVar4 = AccessChain(this);
    sVar5 = std::
            vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
            ::size(pvVar4);
    pvVar4 = AccessChain(other);
    sVar6 = std::
            vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
            ::size(pvVar4);
    if (sVar6 < sVar5) {
      this_local._7_1_ = false;
    }
    else {
      local_24 = 0;
      while( true ) {
        pvVar4 = AccessChain(this);
        sVar5 = std::
                vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                ::size(pvVar4);
        if (sVar5 <= local_24) break;
        pvVar4 = AccessChain(this);
        this_00 = std::
                  vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                  ::operator[](pvVar4,(ulong)local_24);
        pvVar4 = AccessChain(other);
        other_00 = std::
                   vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                   ::operator[](pvVar4,(ulong)local_24);
        bVar1 = AccessChainEntry::operator!=(this_00,other_00);
        if (bVar1) {
          return false;
        }
        local_24 = local_24 + 1;
      }
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CopyPropagateArrays::MemoryObject::Contains(
    CopyPropagateArrays::MemoryObject* other) {
  if (this->GetVariable() != other->GetVariable()) {
    return false;
  }

  if (AccessChain().size() > other->AccessChain().size()) {
    return false;
  }

  for (uint32_t i = 0; i < AccessChain().size(); i++) {
    if (AccessChain()[i] != other->AccessChain()[i]) {
      return false;
    }
  }
  return true;
}